

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AlterRenameColumn(Parse *pParse,SrcList *pSrc,Token *pOld,Token *pNew)

{
  sqlite3 *db_00;
  int iVar1;
  int iVar2;
  Table *pTVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  Parse *in_RDI;
  int bQuote;
  int iSchema;
  char *zDb;
  char *zNew;
  char *zOld;
  int iCol;
  Table *pTab;
  sqlite3 *db;
  Parse *in_stack_ffffffffffffff78;
  char *pcVar5;
  uint in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  u32 in_stack_ffffffffffffff8c;
  sqlite3 *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined4 uVar6;
  uint uVar7;
  Parse *pParse_00;
  uint local_3c;
  
  db_00 = in_RDI->db;
  uVar6 = 0xaaaaaaaa;
  pTVar3 = sqlite3LocateTableItem
                     ((Parse *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                      (SrcItem *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (((pTVar3 != (Table *)0x0) &&
      (iVar1 = isAlterableTable(in_stack_ffffffffffffff78,(Table *)0x1c7407), iVar1 == 0)) &&
     (iVar1 = isRealTable((Parse *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          (Table *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (int)((ulong)in_stack_ffffffffffffff78 >> 0x20)), iVar1 == 0)) {
    iVar1 = sqlite3SchemaToIndex(db_00,pTVar3->pSchema);
    pParse_00 = (Parse *)db_00->aDb[iVar1].zDbSName;
    iVar2 = sqlite3AuthCheck(pParse_00,iVar1,in_stack_ffffffffffffff98,
                             (char *)in_stack_ffffffffffffff90,
                             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if ((iVar2 == 0) &&
       (pcVar4 = sqlite3NameFromToken
                           ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                            ,(Token *)in_stack_ffffffffffffff78), pcVar4 != (char *)0x0)) {
      local_3c = 0;
      while (((int)local_3c < (int)pTVar3->nCol &&
             (iVar2 = sqlite3StrICmp(pTVar3->aCol[(int)local_3c].zCnName,pcVar4), iVar2 != 0))) {
        local_3c = local_3c + 1;
      }
      if (local_3c == (int)pTVar3->nCol) {
        sqlite3ErrorMsg(in_RDI,"no such column: \"%T\"",in_RDX);
      }
      else {
        renameTestSchema((Parse *)CONCAT44(iVar1,uVar6),in_stack_ffffffffffffff98,
                         (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff84);
        renameFixQuotes((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (char *)in_stack_ffffffffffffff78,0);
        sqlite3MayAbort(in_RDI);
        pcVar4 = sqlite3NameFromToken
                           ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                            ,(Token *)in_stack_ffffffffffffff78);
        if (pcVar4 != (char *)0x0) {
          in_stack_ffffffffffffff80 = ""[*(byte *)*in_RCX] & 0x80;
          in_stack_ffffffffffffff90 = (sqlite3 *)pTVar3->zName;
          in_stack_ffffffffffffff88 = (uint)(iVar1 == 1);
          pcVar5 = pcVar4;
          uVar7 = in_stack_ffffffffffffff80;
          sqlite3NestedParse(in_RDI,
                             "UPDATE \"%w\".sqlite_master SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) WHERE name NOT LIKE \'sqliteX_%%\' ESCAPE \'X\'  AND (type != \'index\' OR tbl_name = %Q)"
                             ,pParse_00,pParse_00,pTVar3->zName,(ulong)local_3c,pcVar4);
          in_stack_ffffffffffffff78 = (Parse *)CONCAT44((int)((ulong)pcVar5 >> 0x20),uVar7);
          sqlite3NestedParse(in_RDI,
                             "UPDATE temp.sqlite_master SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) WHERE type IN (\'trigger\', \'view\')"
                             ,pParse_00,pTVar3->zName,(ulong)local_3c,pcVar4);
          renameReloadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                             (u16)((ulong)in_stack_ffffffffffffff78 >> 0x10));
          renameTestSchema((Parse *)CONCAT44(iVar1,uVar7),in_stack_ffffffffffffff98,
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff84);
        }
      }
    }
  }
  sqlite3SrcListDelete
            (in_stack_ffffffffffffff90,
             (SrcList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff78);
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff78);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameColumn(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* Table being altered.  pSrc->nSrc==1 */
  Token *pOld,                    /* Name of column being changed */
  Token *pNew                     /* New column name */
){
  sqlite3 *db = pParse->db;       /* Database connection */
  Table *pTab;                    /* Table being updated */
  int iCol;                       /* Index of column being renamed */
  char *zOld = 0;                 /* Old column name */
  char *zNew = 0;                 /* New column name */
  const char *zDb;                /* Name of schema containing the table */
  int iSchema;                    /* Index of the schema */
  int bQuote;                     /* True to quote the new name */

  /* Locate the table to be altered */
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_column;

  /* Cannot alter a system table */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_rename_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 0) ) goto exit_rename_column;

  /* Which schema holds the table to be altered */
  iSchema = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iSchema>=0 );
  zDb = db->aDb[iSchema].zDbSName;

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_column;
  }
#endif

  /* Make sure the old name really is a column name in the table to be
  ** altered.  Set iCol to be the index of the column being renamed */
  zOld = sqlite3NameFromToken(db, pOld);
  if( !zOld ) goto exit_rename_column;
  for(iCol=0; iCol<pTab->nCol; iCol++){
    if( 0==sqlite3StrICmp(pTab->aCol[iCol].zCnName, zOld) ) break;
  }
  if( iCol==pTab->nCol ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pOld);
    goto exit_rename_column;
  }

  /* Ensure the schema contains no double-quoted strings */
  renameTestSchema(pParse, zDb, iSchema==1, "", 0);
  renameFixQuotes(pParse, zDb, iSchema==1);

  /* Do the rename operation using a recursive UPDATE statement that
  ** uses the sqlite_rename_column() SQL function to compute the new
  ** CREATE statement text for the sqlite_schema table.
  */
  sqlite3MayAbort(pParse);
  zNew = sqlite3NameFromToken(db, pNew);
  if( !zNew ) goto exit_rename_column;
  assert( pNew->n>0 );
  bQuote = sqlite3Isquote(pNew->z[0]);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) "
      "WHERE name NOT LIKE 'sqliteX_%%' ESCAPE 'X' "
      " AND (type != 'index' OR tbl_name = %Q)",
      zDb,
      zDb, pTab->zName, iCol, zNew, bQuote, iSchema==1,
      pTab->zName
  );

  sqlite3NestedParse(pParse,
      "UPDATE temp." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) "
      "WHERE type IN ('trigger', 'view')",
      zDb, pTab->zName, iCol, zNew, bQuote
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iSchema, INITFLAG_AlterRename);
  renameTestSchema(pParse, zDb, iSchema==1, "after rename", 1);

 exit_rename_column:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zOld);
  sqlite3DbFree(db, zNew);
  return;
}